

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestValueTestCommentBefore::~TestValueTestCommentBefore(TestValueTestCommentBefore *this)

{
  void *in_RDI;
  
  ~TestValueTestCommentBefore((TestValueTestCommentBefore *)0x16b9b8);
  operator_delete(in_RDI);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, CommentBefore) {
  Json::Value val; // fill val
  val.setComment(std::string("// this comment should appear before"), Json::commentBefore);
  Json::StreamWriterBuilder wbuilder;
  wbuilder.settings_["commentStyle"] = "All";
  {
    char const expected[] = "// this comment should appear before\nnull";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "\n";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
  }
  Json::Value other = "hello";
  val.swapPayload(other);
  {
    char const expected[] = "// this comment should appear before\n\"hello\"";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "\n";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
    JSONTEST_ASSERT_STRING_EQUAL("null\n", other.toStyledString());
  }
  val = "hello";
  // val.setComment("// this comment should appear before", Json::CommentPlacement::commentBefore);
  // Assignment over-writes comments.
  {
    char const expected[] = "\"hello\"";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
  }
}